

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O1

void Abc_NtkFxuFreeInfo(Fxu_Data_t *p)

{
  void *__ptr;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  if ((p->vFaninsNew != (Vec_Ptr_t *)0x0) && (pVVar1 = p->vFaninsNew, 0 < pVVar1->nSize)) {
    lVar2 = 0;
    do {
      __ptr = pVVar1->pArray[lVar2];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar2 = lVar2 + 1;
      pVVar1 = p->vFaninsNew;
    } while (lVar2 < pVVar1->nSize);
  }
  pVVar1 = p->vSops;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vSopsNew;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vFanins;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vFaninsNew;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
    return;
  }
  return;
}

Assistant:

void Abc_NtkFxuFreeInfo( Fxu_Data_t * p )
{
    int i;
    // free the arrays of new fanins
    if ( p->vFaninsNew )
        for ( i = 0; i < p->vFaninsNew->nSize; i++ )
            if ( p->vFaninsNew->pArray[i] )
                Vec_IntFree( (Vec_Int_t *)p->vFaninsNew->pArray[i] );
    // free the arrays
    if ( p->vSops      ) Vec_PtrFree( p->vSops      );
    if ( p->vSopsNew   ) Vec_PtrFree( p->vSopsNew   );
    if ( p->vFanins    ) Vec_PtrFree( p->vFanins    );
    if ( p->vFaninsNew ) Vec_PtrFree( p->vFaninsNew );
//    ABC_FREE( p );
}